

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcExact.c
# Opt level: O1

Abc_Obj_t *
Abc_ExactBuildNode(word *pTruth,int nVars,int *pArrTimeProfile,Abc_Obj_t **pFanins,Abc_Ntk_t *pNtk)

{
  char cVar1;
  byte bVar2;
  ulong uVar3;
  Abc_Ntk_t *pNtk_00;
  int iVar4;
  uint *__ptr;
  void *pvVar5;
  Abc_Obj_t *pAVar6;
  char *pName;
  char *pcVar7;
  uint uVar8;
  long lVar9;
  long lVar10;
  Abc_Obj_t **ppAVar11;
  byte *pbVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  char pGateTruth [5];
  char *pSol;
  timespec ts_3;
  int pNormalArrTime [8];
  int nMaxArrival;
  byte local_9d [5];
  Abc_Obj_t **local_98;
  ulong local_90;
  char *local_88;
  char *local_80;
  timespec local_78;
  timespec local_68 [2];
  long local_48;
  Abc_Ntk_t *local_40;
  int local_34;
  
  uVar3 = (ulong)(uint)nVars;
  local_80 = (char *)0x0;
  local_98 = pFanins;
  iVar4 = clock_gettime(3,local_68);
  if (iVar4 < 0) {
    lVar9 = 1;
  }
  else {
    lVar9 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_68[0].tv_nsec),8);
    lVar9 = ((lVar9 >> 7) - (lVar9 >> 0x3f)) + local_68[0].tv_sec * -1000000;
  }
  if (nVars == 0) {
    iVar4 = clock_gettime(3,local_68);
    if (iVar4 < 0) {
      lVar10 = -1;
    }
    else {
      lVar10 = local_68[0].tv_nsec / 1000 + local_68[0].tv_sec * 1000000;
    }
    s_pSesStore->timeTotal = s_pSesStore->timeTotal + lVar10 + lVar9;
    if ((*pTruth & 1) == 0) {
      pAVar6 = Abc_NtkCreateNodeConst0(pNtk);
    }
    else {
      pAVar6 = Abc_NtkCreateNodeConst1(pNtk);
    }
  }
  else if (nVars == 1) {
    iVar4 = clock_gettime(3,local_68);
    if (iVar4 < 0) {
      lVar10 = -1;
    }
    else {
      lVar10 = local_68[0].tv_nsec / 1000 + local_68[0].tv_sec * 1000000;
    }
    s_pSesStore->timeTotal = s_pSesStore->timeTotal + lVar10 + lVar9;
    if ((*pTruth & 1) == 0) {
      pAVar6 = Abc_NtkCreateNodeBuf(pNtk,*local_98);
    }
    else {
      pAVar6 = Abc_NtkCreateNodeInv(pNtk,*local_98);
    }
  }
  else {
    local_90 = uVar3;
    if (0 < nVars) {
      memcpy(local_68,pArrTimeProfile,uVar3 * 4);
    }
    iVar4 = (int)local_90;
    Abc_NormalizeArrivalTimes((int *)local_68,iVar4,&local_34);
    iVar4 = Ses_StoreGetEntry(s_pSesStore,pTruth,iVar4,(int *)local_68,&local_80);
    if (iVar4 == 0) {
      __assert_fail("Ses_StoreGetEntry( s_pSesStore, pTruth, nVars, pNormalArrTime, &pSol )",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcExact.c"
                    ,0xb68,
                    "Abc_Obj_t *Abc_ExactBuildNode(word *, int, int *, Abc_Obj_t **, Abc_Ntk_t *)");
    }
    if (local_80 == (char *)0x0) {
      iVar4 = clock_gettime(3,&local_78);
      if (iVar4 < 0) {
        lVar10 = -1;
      }
      else {
        lVar10 = local_78.tv_nsec / 1000 + local_78.tv_sec * 1000000;
      }
      s_pSesStore->timeTotal = s_pSesStore->timeTotal + lVar10 + lVar9;
      pAVar6 = (Abc_Obj_t *)0x0;
    }
    else {
      iVar4 = (int)local_90;
      if (*local_80 != (int)local_90) {
        __assert_fail("pSol[ABC_EXACT_SOL_NVARS] == nVars",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcExact.c"
                      ,0xb6f,
                      "Abc_Obj_t *Abc_ExactBuildNode(word *, int, int *, Abc_Obj_t **, Abc_Ntk_t *)"
                     );
      }
      local_48 = lVar9;
      if (local_80[1] != '\x01') {
        __assert_fail("pSol[ABC_EXACT_SOL_NFUNC] == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcExact.c"
                      ,0xb70,
                      "Abc_Obj_t *Abc_ExactBuildNode(word *, int, int *, Abc_Obj_t **, Abc_Ntk_t *)"
                     );
      }
      local_88 = local_80;
      cVar1 = local_80[2];
      uVar13 = cVar1 + (int)local_90;
      local_40 = pNtk;
      __ptr = (uint *)malloc(0x10);
      uVar8 = 8;
      if (6 < (cVar1 + iVar4) - 1U) {
        uVar8 = uVar13;
      }
      __ptr[1] = 0;
      *__ptr = uVar8;
      if (uVar8 == 0) {
        pvVar5 = (void *)0x0;
      }
      else {
        pvVar5 = malloc((long)(int)uVar8 << 3);
      }
      *(void **)(__ptr + 2) = pvVar5;
      local_9d[3] = 0x30;
      local_9d[4] = 0;
      if (0 < (int)local_90) {
        uVar15 = 0;
        ppAVar11 = local_98;
        do {
          pAVar6 = ppAVar11[uVar15];
          if (pAVar6 == (Abc_Obj_t *)0x0) {
            __assert_fail("pFanins[i]",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcExact.c"
                          ,0xb79,
                          "Abc_Obj_t *Abc_ExactBuildNode(word *, int, int *, Abc_Obj_t **, Abc_Ntk_t *)"
                         );
          }
          uVar8 = __ptr[1];
          uVar13 = *__ptr;
          if (uVar8 == uVar13) {
            if ((int)uVar13 < 0x10) {
              if (*(void **)(__ptr + 2) == (void *)0x0) {
                pvVar5 = malloc(0x80);
              }
              else {
                pvVar5 = realloc(*(void **)(__ptr + 2),0x80);
              }
              uVar14 = 0x10;
            }
            else {
              uVar14 = uVar13 * 2;
              if ((int)uVar14 <= (int)uVar13) goto LAB_002bf8be;
              if (*(void **)(__ptr + 2) == (void *)0x0) {
                pvVar5 = malloc((ulong)uVar13 << 4);
              }
              else {
                pvVar5 = realloc(*(void **)(__ptr + 2),(ulong)uVar13 << 4);
              }
            }
            *(void **)(__ptr + 2) = pvVar5;
            *__ptr = uVar14;
            ppAVar11 = local_98;
          }
LAB_002bf8be:
          __ptr[1] = uVar8 + 1;
          *(Abc_Obj_t **)(*(long *)(__ptr + 2) + (long)(int)uVar8 * 8) = pAVar6;
          uVar15 = uVar15 + 1;
        } while (uVar3 != uVar15);
      }
      pbVar12 = (byte *)(local_88 + 3);
      if ('\0' < local_88[2]) {
        ppAVar11 = (Abc_Obj_t **)0x0;
        do {
          pNtk_00 = local_40;
          local_9d[2] = *pbVar12 & 1 | 0x30;
          local_9d[1] = *pbVar12 >> 1 & 1 | 0x30;
          local_9d[0] = *pbVar12 >> 2 & 1 | 0x30;
          if (pbVar12[1] != 2) {
            __assert_fail("*p == 2",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcExact.c"
                          ,0xb86,
                          "Abc_Obj_t *Abc_ExactBuildNode(word *, int, int *, Abc_Obj_t **, Abc_Ntk_t *)"
                         );
          }
          uVar8 = (int)ppAVar11 + 1;
          if (uVar8 == (int)local_88[2]) {
            if ((char)pbVar12[4] < '\0') {
              __assert_fail("Lit >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                            ,0x130,"int Abc_LitIsCompl(int)");
            }
            if ((pbVar12[4] & 1) != 0) {
              lVar9 = 0;
              do {
                local_9d[lVar9] = local_9d[lVar9] == 0x30 | 0x30;
                lVar9 = lVar9 + 1;
              } while (lVar9 != 4);
            }
          }
          local_98 = (Abc_Obj_t **)(ulong)uVar8;
          pName = Abc_SopFromTruthBin((char *)local_9d);
          pAVar6 = Abc_NtkCreateObj(pNtk_00,ABC_OBJ_NODE);
          if (pAVar6 == (Abc_Obj_t *)0x0) {
            __assert_fail("pObj",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcExact.c"
                          ,0xb90,
                          "Abc_Obj_t *Abc_ExactBuildNode(word *, int, int *, Abc_Obj_t **, Abc_Ntk_t *)"
                         );
          }
          pcVar7 = Abc_SopRegister((Mem_Flex_t *)pNtk_00->pManFunc,pName);
          (pAVar6->field_5).pData = pcVar7;
          uVar8 = __ptr[1];
          uVar13 = *__ptr;
          if (uVar8 == uVar13) {
            if ((int)uVar13 < 0x10) {
              if (*(void **)(__ptr + 2) == (void *)0x0) {
                pvVar5 = malloc(0x80);
              }
              else {
                pvVar5 = realloc(*(void **)(__ptr + 2),0x80);
              }
              uVar14 = 0x10;
            }
            else {
              uVar14 = uVar13 * 2;
              if ((int)uVar14 <= (int)uVar13) goto LAB_002bfa09;
              if (*(void **)(__ptr + 2) == (void *)0x0) {
                pvVar5 = malloc((ulong)uVar13 << 4);
              }
              else {
                pvVar5 = realloc(*(void **)(__ptr + 2),(ulong)uVar13 << 4);
              }
            }
            *(void **)(__ptr + 2) = pvVar5;
            *__ptr = uVar14;
          }
LAB_002bfa09:
          lVar9 = *(long *)(__ptr + 2);
          __ptr[1] = uVar8 + 1;
          *(Abc_Obj_t **)(lVar9 + (long)(int)uVar8 * 8) = pAVar6;
          if (pName != (char *)0x0) {
            free(pName);
          }
          bVar2 = pbVar12[2];
          if (((char)bVar2 < '\0') || ((int)uVar8 < (int)(char)bVar2)) goto LAB_002bfb66;
          Abc_ObjAddFanin(pAVar6,*(Abc_Obj_t **)(lVar9 + (ulong)(uint)(int)(char)bVar2 * 8));
          bVar2 = pbVar12[3];
          if (((char)bVar2 < '\0') || ((int)uVar8 < (int)(char)bVar2)) goto LAB_002bfb66;
          pbVar12 = pbVar12 + 4;
          Abc_ObjAddFanin(pAVar6,*(Abc_Obj_t **)(lVar9 + (ulong)(uint)(int)(char)bVar2 * 8));
          ppAVar11 = local_98;
        } while ((int)local_98 < (int)local_88[2]);
      }
      if ((char)*pbVar12 < '\0') {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                      ,0x12f,"int Abc_Lit2Var(int)");
      }
      uVar8 = (uint)(*pbVar12 >> 1) + (int)local_90;
      if (((int)uVar8 < 0) || ((int)__ptr[1] <= (int)uVar8)) {
LAB_002bfb66:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pvVar5 = *(void **)(__ptr + 2);
      pAVar6 = *(Abc_Obj_t **)((long)pvVar5 + (ulong)uVar8 * 8);
      if (pvVar5 != (void *)0x0) {
        free(pvVar5);
        __ptr[2] = 0;
        __ptr[3] = 0;
      }
      free(__ptr);
      iVar4 = clock_gettime(3,&local_78);
      if (iVar4 < 0) {
        lVar9 = -1;
      }
      else {
        lVar9 = local_78.tv_nsec / 1000 + local_78.tv_sec * 1000000;
      }
      s_pSesStore->timeTotal = s_pSesStore->timeTotal + lVar9 + local_48;
    }
  }
  return pAVar6;
}

Assistant:

Abc_Obj_t * Abc_ExactBuildNode( word * pTruth, int nVars, int * pArrTimeProfile, Abc_Obj_t ** pFanins, Abc_Ntk_t * pNtk )
{
    char * pSol = NULL;
    int i, j, nMaxArrival;
    int pNormalArrTime[8];
    char const * p;
    Abc_Obj_t * pObj;
    Vec_Ptr_t * pGates;
    char pGateTruth[5];
    char * pSopCover;
    abctime timeStart = Abc_Clock();

    if ( nVars == 0 )
    {
        s_pSesStore->timeTotal += ( Abc_Clock() - timeStart );
        return (pTruth[0] & 1) ? Abc_NtkCreateNodeConst1(pNtk) : Abc_NtkCreateNodeConst0(pNtk);
    }
    if ( nVars == 1 )
    {
        s_pSesStore->timeTotal += ( Abc_Clock() - timeStart );
        return (pTruth[0] & 1) ? Abc_NtkCreateNodeInv(pNtk, pFanins[0]) : Abc_NtkCreateNodeBuf(pNtk, pFanins[0]);
    }

    for ( i = 0; i < nVars; ++i )
        pNormalArrTime[i] = pArrTimeProfile[i];
    Abc_NormalizeArrivalTimes( pNormalArrTime, nVars, &nMaxArrival );
    assert( Ses_StoreGetEntry( s_pSesStore, pTruth, nVars, pNormalArrTime, &pSol ) );
    if ( !pSol )
    {
        s_pSesStore->timeTotal += ( Abc_Clock() - timeStart );
        return NULL;
    }

    assert( pSol[ABC_EXACT_SOL_NVARS] == nVars );
    assert( pSol[ABC_EXACT_SOL_NFUNC] == 1 );

    pGates = Vec_PtrAlloc( nVars + pSol[ABC_EXACT_SOL_NGATES] );
    pGateTruth[3] = '0';
    pGateTruth[4] = '\0';

    /* primary inputs */
    for ( i = 0; i < nVars; ++i )
    {
        assert( pFanins[i] );
        Vec_PtrPush( pGates, pFanins[i] );
    }

    /* gates */
    p = pSol + 3;
    for ( i = 0; i < pSol[ABC_EXACT_SOL_NGATES]; ++i )
    {
        pGateTruth[2] = '0' + ( *p & 1 );
        pGateTruth[1] = '0' + ( ( *p >> 1 ) & 1 );
        pGateTruth[0] = '0' + ( ( *p >> 2 ) & 1 );
        ++p;

        assert( *p == 2 ); /* binary gate */
        ++p;

        /* invert truth table if we are last gate and inverted */
        if ( i + 1 == pSol[ABC_EXACT_SOL_NGATES] && Abc_LitIsCompl( *( p + 2 ) ) )
            for ( j = 0; j < 4; ++j )
                pGateTruth[j] = ( pGateTruth[j] == '0' ) ? '1' : '0';

        pSopCover = Abc_SopFromTruthBin( pGateTruth );
        pObj = Abc_NtkCreateNode( pNtk );
        assert( pObj );
        pObj->pData = Abc_SopRegister( (Mem_Flex_t*)pNtk->pManFunc, pSopCover );
        Vec_PtrPush( pGates, pObj );
        ABC_FREE( pSopCover );

        Abc_ObjAddFanin( pObj, (Abc_Obj_t *)Vec_PtrEntry( pGates, *p++ ) );
        Abc_ObjAddFanin( pObj, (Abc_Obj_t *)Vec_PtrEntry( pGates, *p++ ) );
    }

    /* output */
    pObj = (Abc_Obj_t *)Vec_PtrEntry( pGates, nVars + Abc_Lit2Var( *p ) );

    Vec_PtrFree( pGates );

    s_pSesStore->timeTotal += ( Abc_Clock() - timeStart );
    return pObj;
}